

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall spvtools::opt::IRContext::AddVarToEntryPoints(IRContext *this,uint32_t var_id)

{
  Module *pMVar1;
  Instruction *this_00;
  DefUseManager *this_01;
  Instruction *e;
  Instruction **ppIVar2;
  initializer_list<unsigned_int> init_list;
  bool found;
  uint32_t var_id_local;
  uint32_t local_98;
  uint32_t ocnt;
  IRContext *local_90;
  long *local_88;
  SmallVector<unsigned_int,_2UL> local_80;
  SmallVector<unsigned_int,_2UL> local_58;
  
  ocnt = 0;
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar2 = (Instruction **)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  var_id_local = var_id;
  local_90 = this;
  while (this_00 = *ppIVar2,
        this_00 !=
        (Instruction *)
        ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    found = false;
    local_80._vptr_SmallVector = (_func_int **)0x0;
    local_88 = (long *)::operator_new(0x18);
    *local_88 = (long)&ocnt;
    local_88[1] = (long)&found;
    local_88[2] = (long)&var_id_local;
    local_80.buffer =
         (PodType  [2])
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:841:24)>
         ::_M_invoke;
    local_80.size_ =
         (size_t)std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:841:24)>
                 ::_M_manager;
    Instruction::ForEachInOperand(this_00,(function<void_(unsigned_int_*)> *)&local_88);
    if ((code *)local_80.size_ != (code *)0x0) {
      (*(code *)local_80.size_)((Operand *)&local_88,(Operand *)&local_88,3);
    }
    if (found == false) {
      local_98 = var_id_local;
      init_list._M_len = 1;
      init_list._M_array = &local_98;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      local_88 = (long *)CONCAT44(local_88._4_4_,1);
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_80,&local_58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&this_00->operands_,(Operand *)&local_88);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_80);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      this_01 = get_def_use_mgr(local_90);
      analysis::DefUseManager::AnalyzeInstDefUse(this_01,this_00);
    }
    ppIVar2 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return;
}

Assistant:

void IRContext::AddVarToEntryPoints(uint32_t var_id) {
  uint32_t ocnt = 0;
  for (auto& e : module()->entry_points()) {
    bool found = false;
    e.ForEachInOperand([&ocnt, &found, &var_id](const uint32_t* idp) {
      if (ocnt >= kEntryPointInterfaceInIdx) {
        if (*idp == var_id) found = true;
      }
      ++ocnt;
    });
    if (!found) {
      e.AddOperand({SPV_OPERAND_TYPE_ID, {var_id}});
      get_def_use_mgr()->AnalyzeInstDefUse(&e);
    }
  }
}